

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::RenderCollapseTriangle(ImVec2 p_min,bool is_open,float scale,bool shadow)

{
  ImDrawList *pIVar1;
  ImGuiContext *pIVar2;
  ImU32 IVar3;
  ImGuiWindow *pIVar4;
  ImVec2 local_120;
  ImVec2 local_118;
  ImVec2 local_110;
  ImVec2 local_108;
  ImVec2 local_100;
  ImVec2 local_f8;
  ImVec2 local_f0;
  ImVec2 local_e8;
  ImVec2 local_e0;
  ImVec2 local_d8;
  ImVec2 local_d0;
  ImVec2 local_c8;
  ImVec2 local_c0;
  ImVec2 local_b8;
  ImVec2 local_b0;
  ImVec2 local_a8;
  ImVec2 local_a0;
  ImVec2 local_98;
  ImVec2 local_90;
  ImVec2 local_88;
  ImVec2 local_80;
  ImVec2 local_78;
  ImVec2 local_70;
  ImVec2 local_68;
  ImVec2 local_60;
  ImVec2 c;
  ImVec2 b;
  ImVec2 a;
  ImVec2 local_40;
  ImVec2 center;
  float r;
  float h;
  ImGuiWindow *window;
  ImGuiContext *g;
  bool shadow_local;
  float scale_local;
  bool is_open_local;
  ImVec2 p_min_local;
  
  pIVar2 = GImGui;
  _scale_local = p_min;
  pIVar4 = GetCurrentWindow();
  center.y = pIVar2->FontSize;
  center.x = center.y * 0.4 * scale;
  ImVec2::ImVec2(&a,center.y * 0.5,center.y * 0.5 * scale);
  local_40 = ::operator+((ImVec2 *)&scale_local,&a);
  ImVec2::ImVec2(&b);
  ImVec2::ImVec2(&c);
  ImVec2::ImVec2(&local_60);
  if (is_open) {
    local_40.y = local_40.y + center.x * -0.25;
    ImVec2::ImVec2(&local_78,0.0,1.0);
    local_70 = ::operator*(&local_78,center.x);
    local_68 = ::operator+(&local_40,&local_70);
    b = local_68;
    ImVec2::ImVec2(&local_90,-0.866,-0.5);
    local_88 = ::operator*(&local_90,center.x);
    local_80 = ::operator+(&local_40,&local_88);
    c = local_80;
    ImVec2::ImVec2(&local_a8,0.866,-0.5);
    local_a0 = ::operator*(&local_a8,center.x);
    local_98 = ::operator+(&local_40,&local_a0);
    local_60 = local_98;
  }
  else {
    ImVec2::ImVec2(&local_c0,1.0,0.0);
    local_b8 = ::operator*(&local_c0,center.x);
    local_b0 = ::operator+(&local_40,&local_b8);
    b = local_b0;
    ImVec2::ImVec2(&local_d8,-0.5,0.866);
    local_d0 = ::operator*(&local_d8,center.x);
    local_c8 = ::operator+(&local_40,&local_d0);
    c = local_c8;
    ImVec2::ImVec2(&local_f0,-0.5,-0.866);
    local_e8 = ::operator*(&local_f0,center.x);
    local_e0 = ::operator+(&local_40,&local_e8);
    local_60 = local_e0;
  }
  if ((shadow) && ((pIVar4->Flags & 0x80U) != 0)) {
    pIVar1 = pIVar4->DrawList;
    ImVec2::ImVec2(&local_100,2.0,2.0);
    local_f8 = ::operator+(&b,&local_100);
    ImVec2::ImVec2(&local_110,2.0,2.0);
    local_108 = ::operator+(&c,&local_110);
    ImVec2::ImVec2(&local_120,2.0,2.0);
    local_118 = ::operator+(&local_60,&local_120);
    IVar3 = GetColorU32(6,1.0);
    ImDrawList::AddTriangleFilled(pIVar1,&local_f8,&local_108,&local_118,IVar3);
  }
  pIVar1 = pIVar4->DrawList;
  IVar3 = GetColorU32(0,1.0);
  ImDrawList::AddTriangleFilled(pIVar1,&b,&c,&local_60,IVar3);
  return;
}

Assistant:

void ImGui::RenderCollapseTriangle(ImVec2 p_min, bool is_open, float scale, bool shadow)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    const float h = g.FontSize * 1.00f;
    const float r = h * 0.40f * scale;
    ImVec2 center = p_min + ImVec2(h*0.50f, h*0.50f*scale);

    ImVec2 a, b, c;
    if (is_open)
    {
        center.y -= r*0.25f;
        a = center + ImVec2(0,1)*r;
        b = center + ImVec2(-0.866f,-0.5f)*r;
        c = center + ImVec2(0.866f,-0.5f)*r;
    }
    else
    {
        a = center + ImVec2(1,0)*r;
        b = center + ImVec2(-0.500f,0.866f)*r;
        c = center + ImVec2(-0.500f,-0.866f)*r;
    }

    if (shadow && (window->Flags & ImGuiWindowFlags_ShowBorders) != 0)
        window->DrawList->AddTriangleFilled(a+ImVec2(2,2), b+ImVec2(2,2), c+ImVec2(2,2), GetColorU32(ImGuiCol_BorderShadow));
    window->DrawList->AddTriangleFilled(a, b, c, GetColorU32(ImGuiCol_Text));
}